

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::child(xml_node *this,char_t *name_)

{
  xml_node_struct *p;
  bool bVar1;
  xml_node local_20;
  
  if (this->_root != (xml_node_struct *)0x0) {
    for (p = this->_root->first_child; p != (xml_node_struct *)0x0; p = p->next_sibling) {
      if ((p->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(name_,p->name), bVar1)) {
        xml_node(&local_20,p);
        if (p != (xml_node_struct *)0x0) {
          return (xml_node)local_20._root;
        }
        break;
      }
    }
  }
  xml_node(&local_20);
  return (xml_node)local_20._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::child(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}